

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnmerge.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  FILE *__s;
  FILE *__s_00;
  char *pcVar3;
  FILE *pFVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int top_count;
  int bottom_count;
  int layer_count;
  int blob_count;
  int magic;
  string ns;
  char layer_type [33];
  char layer_name [257];
  char bottom_name [257];
  char line [1024];
  int local_12ec;
  uint local_12e8;
  uint local_12e4;
  int local_12e0;
  uint local_12dc;
  int local_12d8;
  int local_12d4;
  char **local_12d0;
  char *local_12c8;
  ulong local_12c0;
  FILE *local_12b8;
  undefined1 *local_12b0 [2];
  undefined1 local_12a0 [16];
  ulong local_1290;
  undefined1 local_1288 [48];
  allocator local_1258 [272];
  undefined1 local_1148 [272];
  undefined1 *local_1038 [2];
  undefined1 local_1028 [4088];
  
  local_12d0 = argv;
  if ((argc < 7) || ((argc - 1U & 1) != 0)) {
    main_cold_1();
    iVar9 = -1;
  }
  else {
    pcVar10 = argv[argc - 1U];
    __s = fopen(argv[(ulong)(uint)argc - 2],"wb");
    __s_00 = fopen(pcVar10,"wb");
    fwrite("7767517\n",8,1,__s);
    fwrite("           \n",0xc,1,__s);
    local_12c0 = (ulong)(argc - 3U >> 1);
    uVar8 = 0;
    local_12e4 = 0;
    local_12dc = 0;
    do {
      pcVar10 = local_12d0[uVar8 * 2 + 1];
      local_12c8 = local_12d0[uVar8 * 2 + 2];
      local_1290 = uVar8;
      pcVar3 = strrchr(pcVar10,0x2f);
      pcVar5 = pcVar3 + 1;
      if (pcVar3 == (char *)0x0) {
        pcVar5 = pcVar10;
      }
      pcVar3 = strrchr(pcVar5,0x2e);
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::string::string((string *)local_12b0,pcVar5,(allocator *)local_1038);
      }
      else {
        std::__cxx11::string::string((string *)local_1038,pcVar5,local_1258);
        std::__cxx11::string::substr((ulong)local_12b0,(ulong)local_1038);
        if (local_1038[0] != local_1028) {
          operator_delete(local_1038[0]);
        }
      }
      pFVar4 = fopen(pcVar10,"rb");
      if (pFVar4 == (FILE *)0x0) {
        fprintf(_stderr,"fopen %s failed\n",pcVar10);
      }
      else {
        local_12d4 = 0;
        uVar1 = __isoc99_fscanf(pFVar4,"%d",&local_12d4);
        if ((uVar1 == 1) && (local_12d4 == 0x7685dd)) {
          local_12e0 = 0;
          local_12d8 = 0;
          uVar1 = __isoc99_fscanf(pFVar4,"%d %d",&local_12e0,&local_12d8);
          if (uVar1 == 2) {
            local_12dc = local_12dc + local_12e0;
            local_12e4 = local_12e4 + local_12d8;
            if (0 < local_12e0) {
              iVar9 = 0;
              do {
                local_12e8 = 0;
                local_12ec = 0;
                uVar1 = __isoc99_fscanf(pFVar4,"%32s %256s %d %d",local_1288,local_1258,&local_12e8,
                                        &local_12ec);
                if (uVar1 != 4) {
                  pcVar10 = "read layer params failed %d\n";
LAB_001015c4:
                  fprintf(_stderr,pcVar10,(ulong)uVar1);
                  goto LAB_001015d2;
                }
                fprintf(__s,"%-24s %s/%-24s %d %d",local_1288,local_12b0[0],local_1258,
                        (ulong)local_12e8,local_12ec);
                if (0 < (int)local_12e8) {
                  iVar12 = 0;
                  do {
                    uVar1 = __isoc99_fscanf(pFVar4,"%256s",local_1148);
                    if (uVar1 != 1) {
                      pcVar10 = "read bottom_name failed %d\n";
                      goto LAB_001015c4;
                    }
                    fprintf(__s," %s/%s",local_12b0[0],local_1148);
                    iVar12 = iVar12 + 1;
                  } while (iVar12 < (int)local_12e8);
                }
                if (0 < local_12ec) {
                  iVar12 = 0;
                  do {
                    uVar1 = __isoc99_fscanf(pFVar4,"%256s",local_1148);
                    if (uVar1 != 1) {
                      pcVar10 = "read top_name failed %d\n";
                      goto LAB_001015c4;
                    }
                    fprintf(__s," %s/%s",local_12b0[0],local_1148);
                    iVar12 = iVar12 + 1;
                  } while (iVar12 < local_12ec);
                }
                pcVar5 = fgets((char *)local_1038,0x400,pFVar4);
                if (pcVar5 == (char *)0x0) {
                  fprintf(_stderr,"read line %s failed\n",pcVar10);
                  break;
                }
                fputs((char *)local_1038,__s);
                iVar9 = iVar9 + 1;
              } while (iVar9 < local_12e0);
            }
            fclose(pFVar4);
            goto LAB_001015d2;
          }
          pcVar10 = "read layer_count and blob_count failed %d\n";
        }
        else {
          pcVar10 = "read magic failed %d\n";
        }
        fprintf(_stderr,pcVar10,(ulong)uVar1);
      }
LAB_001015d2:
      uVar11 = local_12c0;
      if (local_12b0[0] != local_12a0) {
        operator_delete(local_12b0[0]);
      }
      pFVar4 = fopen(local_12c8,"rb");
      if (pFVar4 == (FILE *)0x0) {
        fprintf(_stderr,"fopen %s failed\n",local_12c8);
      }
      else {
        iVar9 = 0;
        fseek(pFVar4,0,2);
        lVar6 = ftell(pFVar4);
        local_12b8 = pFVar4;
        rewind(pFVar4);
        iVar12 = (int)lVar6;
        if (0xfff < iVar12) {
          iVar13 = 0;
          do {
            sVar7 = fread(local_1038,1,0x1000,local_12b8);
            sVar7 = fwrite(local_1038,1,sVar7,__s_00);
            iVar9 = (int)sVar7 + iVar13;
            iVar2 = (int)sVar7 + iVar13;
            iVar13 = iVar9;
          } while (iVar2 + 0xfff < iVar12);
        }
        pFVar4 = local_12b8;
        sVar7 = fread(local_1038,1,(long)(iVar12 - iVar9),local_12b8);
        sVar7 = fwrite(local_1038,1,sVar7,__s_00);
        if ((int)sVar7 + iVar9 != iVar12) {
          fprintf(_stderr,"copy %s incomplete\n",local_12c8);
        }
        fclose(pFVar4);
        uVar11 = local_12c0;
      }
      uVar8 = local_1290 + 1;
    } while (uVar8 != uVar11);
    rewind(__s);
    fwrite("7767517\n",8,1,__s);
    iVar9 = 0;
    fprintf(__s,"%d %d",(ulong)local_12dc,(ulong)local_12e4);
    fclose(__s);
    fclose(__s_00);
  }
  return iVar9;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 7 || (argc - 1) % 2 != 0)
    {
        fprintf(stderr, "Usage: %s [param1] [bin1] [param2] [bin2] ... [outparam] [outbin]\n", argv[0]);
        return -1;
    }

    const char* outparampath = argv[argc - 2];
    const char* outbinpath = argv[argc - 1];

    FILE* outparamfp = fopen(outparampath, "wb");
    FILE* outbinfp = fopen(outbinpath, "wb");

    // magic
    fprintf(outparamfp, "7767517\n");

    // layer count and blob count placeholder
    // 99999 is large enough I think  --- nihui
    fprintf(outparamfp, "           \n");

    int total_layer_count = 0;
    int total_blob_count = 0;

    const int model_count = (argc - 3) / 2;

    for (int i = 0; i < model_count; i++)
    {
        const char* parampath = argv[i * 2 + 1];
        const char* binpath = argv[i * 2 + 2];

        copy_param(parampath, outparamfp, &total_layer_count, &total_blob_count);
        copy_bin(binpath, outbinfp);
    }

    // the real layer count and blob count
    rewind(outparamfp);
    fprintf(outparamfp, "7767517\n");
    fprintf(outparamfp, "%d %d", total_layer_count, total_blob_count);

    fclose(outparamfp);
    fclose(outbinfp);

    return 0;
}